

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

FlagList * absl::internal::anon_unknown_1::GetFlagList(void)

{
  int iVar1;
  FlagList *pFVar2;
  
  if ((anonymous_namespace)::GetFlagList()::flag_list == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::GetFlagList()::flag_list);
    if (iVar1 != 0) {
      pFVar2 = (FlagList *)operator_new(0x18);
      std::
      vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
      ::vector((vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
                *)0x402077);
      GetFlagList::flag_list = pFVar2;
      __cxa_guard_release(&(anonymous_namespace)::GetFlagList()::flag_list);
    }
  }
  return GetFlagList::flag_list;
}

Assistant:

FlagList *GetFlagList() {
  static auto *flag_list = new FlagList;
  return flag_list;
}